

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

void __thiscall cmake::PrintPresetEnvironment(cmake *this)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  char local_39;
  cmake *local_38;
  
  p_Var4 = (this->UnprocessedPresetEnvironment)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
  ;
  p_Var1 = &(this->UnprocessedPresetEnvironment)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var1) {
    bVar2 = true;
    local_38 = this;
    do {
      if ((char)p_Var4[3]._M_color == _S_black) {
        if (bVar2) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Preset environment variables:\n\n",0x1f);
          bVar2 = false;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,*(char **)(p_Var4 + 1),(long)p_Var4[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"=\"",2);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,*(char **)(p_Var4 + 2),(long)p_Var4[2]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"\n",2);
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      this = local_38;
    } while ((_Rb_tree_header *)p_Var4 != p_Var1);
    if (!bVar2) {
      local_39 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_39,1);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::clear(&(this->UnprocessedPresetEnvironment)._M_t);
  return;
}

Assistant:

void cmake::PrintPresetEnvironment()
{
  bool first = true;
  for (auto const& var : this->UnprocessedPresetEnvironment) {
    if (!var.second) {
      continue;
    }
    if (first) {
      std::cout << "Preset environment variables:\n\n";
      first = false;
    }
    std::cout << "  " << var.first << "=\"" << *var.second << "\"\n";
  }
  if (!first) {
    std::cout << '\n';
  }
  this->UnprocessedPresetEnvironment.clear();
}